

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O2

void __thiscall
sptk::reaper::LpcAnalyzer::PcToAutocorPc(LpcAnalyzer *this,float *a,float *b,float *c,int p)

{
  int iVar1;
  float *pfVar2;
  float *ap;
  long lVar3;
  ulong uVar4;
  int i;
  int iVar5;
  float fVar6;
  
  fVar6 = 1.0;
  for (lVar3 = 0; p != (int)lVar3; lVar3 = lVar3 + 1) {
    fVar6 = fVar6 + a[lVar3] * a[lVar3];
  }
  *c = fVar6;
  iVar1 = 0;
  if (0 < p) {
    iVar1 = p;
  }
  pfVar2 = a + 1;
  iVar5 = p + -1;
  for (uVar4 = 1; uVar4 != iVar1 + 1; uVar4 = uVar4 + 1) {
    fVar6 = a[uVar4 - 1];
    for (lVar3 = 0; iVar5 != (int)lVar3; lVar3 = lVar3 + 1) {
      fVar6 = fVar6 + a[lVar3] * pfVar2[lVar3];
    }
    *b = fVar6 + fVar6;
    b = b + 1;
    pfVar2 = pfVar2 + 1;
    iVar5 = iVar5 + -1;
  }
  return;
}

Assistant:

void LpcAnalyzer::PcToAutocorPc(float* a, float* b, float* c, int p) {
  float  s, *ap, *a0;
  int  i, j;

  for (s = 1., ap = a, i = p; i--; ap++)
    s += *ap * *ap;

  *c = s;
  for (i = 1; i <= p; i++) {
    s = a[i - 1];
    for (a0 = a, ap = a + i, j = p - i; j--;)
      s += (*a0++ * *ap++);
    *b++ = 2.0 * s;
  }
}